

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::RegisterProcessForMonitoring
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CSynchData *psdSynchData,
          CProcProcessLocalData *pProcLocalData)

{
  bool bVar1;
  bool bVar2;
  _MonitoredProcessesListNode *p_Var3;
  CPalSynchronizationManager *this_00;
  int *piVar4;
  CPalSynchronizationManager *pSynchManager;
  bool fMonitoredProcessesLock;
  MonitoredProcessesListNode *pMStack_38;
  bool fWakeUpWorker;
  MonitoredProcessesListNode *pmpln;
  PAL_ERROR palErr;
  CProcProcessLocalData *pProcLocalData_local;
  CSynchData *psdSynchData_local;
  CPalThread *pthrCurrent_local;
  CPalSynchronizationManager *this_local;
  
  pmpln._4_4_ = 0;
  bVar1 = false;
  InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  bVar2 = true;
  for (pMStack_38 = this->m_pmplnMonitoredProcesses; pMStack_38 != (MonitoredProcessesListNode *)0x0
      ; pMStack_38 = pMStack_38->pNext) {
    if (psdSynchData == pMStack_38->psdSynchData) {
      if (pMStack_38->dwPid != *(DWORD *)pProcLocalData) {
        fprintf(_stderr,"] %s %s:%d","RegisterProcessForMonitoring",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xb72);
        fprintf(_stderr,
                "Expression: pmpln->dwPid == pProcLocalData->dwProcessId, Description: Invalid node in Monitored Processes List\n"
               );
      }
      break;
    }
  }
  if (pMStack_38 == (MonitoredProcessesListNode *)0x0) {
    p_Var3 = InternalNew<CorUnix::CPalSynchronizationManager::_MonitoredProcessesListNode>();
    if (p_Var3 == (_MonitoredProcessesListNode *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      pmpln._4_4_ = 8;
      goto LAB_0024d57e;
    }
    p_Var3->lRefCount = 1;
    p_Var3->dwPid = *(DWORD *)pProcLocalData;
    p_Var3->dwExitCode = 0;
    p_Var3->pProcLocalData = pProcLocalData;
    p_Var3->psdSynchData = psdSynchData;
    CSynchData::AddRef(psdSynchData);
    p_Var3->pNext = this->m_pmplnMonitoredProcesses;
    this->m_pmplnMonitoredProcesses = p_Var3;
    this->m_lMonitoredProcessesCount = this->m_lMonitoredProcessesCount + 1;
    bVar1 = true;
  }
  else {
    pMStack_38->lRefCount = pMStack_38->lRefCount + 1;
  }
  InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  bVar2 = false;
  if (bVar1) {
    this_00 = GetInstance();
    pmpln._4_4_ = WakeUpLocalWorkerThread(this_00,SynchWorkerCmdNop);
    if (pmpln._4_4_ != 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      piVar4 = __errno_location();
      strerror(*piVar4);
      pmpln._4_4_ = 0x54f;
    }
  }
LAB_0024d57e:
  if (bVar2) {
    InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  }
  return pmpln._4_4_;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::RegisterProcessForMonitoring(
        CPalThread * pthrCurrent,
        CSynchData *psdSynchData,
        CProcProcessLocalData * pProcLocalData)
    {
        PAL_ERROR palErr = NO_ERROR;
        MonitoredProcessesListNode * pmpln;
        bool fWakeUpWorker = false;
        bool fMonitoredProcessesLock = false;

        VALIDATEOBJECT(psdSynchData);

        InternalEnterCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        fMonitoredProcessesLock = true;

        pmpln = m_pmplnMonitoredProcesses;
        while (pmpln)
        {
            if (psdSynchData == pmpln->psdSynchData)
            {
                _ASSERT_MSG(pmpln->dwPid == pProcLocalData->dwProcessId,
                            "Invalid node in Monitored Processes List\n");
                break;
            }

            pmpln = pmpln->pNext;
        }

        if (pmpln)
        {
            pmpln->lRefCount++;
        }
        else
        {
            pmpln = InternalNew<MonitoredProcessesListNode>();
            if (NULL == pmpln)
            {
                ERROR("No memory to allocate MonitoredProcessesListNode structure\n");
                palErr = ERROR_NOT_ENOUGH_MEMORY;
                goto RPFM_exit;
            }

            pmpln->lRefCount      = 1;
            pmpln->dwPid          = pProcLocalData->dwProcessId;
            pmpln->dwExitCode     = 0;
            pmpln->pProcLocalData = pProcLocalData;

            // Acquire SynchData and AddRef it
            pmpln->psdSynchData = psdSynchData;
            psdSynchData->AddRef();

            pmpln->pNext = m_pmplnMonitoredProcesses;
            m_pmplnMonitoredProcesses = pmpln;
            m_lMonitoredProcessesCount++;

            fWakeUpWorker = true;
        }
        // Unlock
        InternalLeaveCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        fMonitoredProcessesLock = false;

        if (fWakeUpWorker)
        {
            CPalSynchronizationManager * pSynchManager = GetInstance();

            palErr = pSynchManager->WakeUpLocalWorkerThread(SynchWorkerCmdNop);
            if (NO_ERROR != palErr)
            {
                ERROR("Failed waking up worker thread for process "
                      "monitoring registration [errno=%d {%s%}]\n",
                      errno, strerror(errno));
                palErr = ERROR_INTERNAL_ERROR;
            }
        }

    RPFM_exit:
        if (fMonitoredProcessesLock)
        {
            InternalLeaveCriticalSection(pthrCurrent,
                                         &s_csMonitoredProcessesLock);
        }
        return palErr;
    }